

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool Dominates(VmBlock *a,VmBlock *b)

{
  bool bVar1;
  uint uVar2;
  VmBlock **ppVVar3;
  VmBlock *child;
  uint i;
  VmBlock *b_local;
  VmBlock *a_local;
  
  if (a == b) {
    a_local._7_1_ = true;
  }
  else {
    for (child._4_4_ = 0; uVar2 = SmallArray<VmBlock_*,_4U>::size(&a->dominanceChildren),
        child._4_4_ < uVar2; child._4_4_ = child._4_4_ + 1) {
      ppVVar3 = SmallArray<VmBlock_*,_4U>::operator[](&a->dominanceChildren,child._4_4_);
      if (*ppVVar3 == b) {
        return true;
      }
      bVar1 = Dominates(*ppVVar3,b);
      if (bVar1) {
        return true;
      }
    }
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool Dominates(VmBlock *a, VmBlock *b)
{
	if(a == b)
		return true;

	for(unsigned i = 0; i < a->dominanceChildren.size(); i++)
	{
		VmBlock *child = a->dominanceChildren[i];

		if(child == b)
			return true;

		if(Dominates(child, b))
			return true;
	}

	return false;
}